

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.hpp
# Opt level: O1

pair<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_bool>
 tf::detail::
 partition_right<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::less<std::__cxx11::string>>
           (string *begin,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *end)

{
  string *psVar1;
  int iVar2;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  long lVar5;
  long lVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  this;
  pair<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_bool>
  pVar9;
  T pivot;
  string *local_50;
  undefined8 local_48;
  long local_40;
  undefined8 uStack_38;
  
  local_50 = (string *)&local_40;
  psVar1 = begin + 0x10;
  if (*(string **)begin == psVar1) {
    local_40 = *(long *)psVar1;
    uStack_38 = *(undefined8 *)(begin + 0x18);
  }
  else {
    local_40 = *(long *)psVar1;
    local_50 = *(string **)begin;
  }
  local_48 = *(undefined8 *)(begin + 8);
  *(string **)begin = psVar1;
  *(undefined8 *)(begin + 8) = 0;
  begin[0x10] = (string)0x0;
  lVar6 = 0x20;
  lVar5 = 0;
  do {
    iVar2 = std::__cxx11::string::compare(begin + lVar6);
    lVar5 = lVar5 + -0x20;
    lVar6 = lVar6 + 0x20;
  } while (iVar2 < 0);
  pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(begin + -lVar5);
  if (lVar5 == -0x20) {
    do {
      if (end <= pbVar4) break;
      end = end + -1;
      iVar2 = std::__cxx11::string::compare((string *)end);
    } while (-1 < iVar2);
  }
  else {
    do {
      end = end + -1;
      iVar2 = std::__cxx11::string::compare((string *)end);
    } while (-1 < iVar2);
  }
  pbVar7 = end;
  pbVar8 = pbVar4;
  if (pbVar4 < end) {
    do {
      std::__cxx11::string::swap((string *)pbVar8);
      do {
        this._M_current = pbVar8;
        pbVar8 = this._M_current + 1;
        iVar2 = std::__cxx11::string::compare((string *)pbVar8);
      } while (iVar2 < 0);
      do {
        pbVar7 = pbVar7 + -1;
        iVar2 = std::__cxx11::string::compare((string *)pbVar7);
      } while (-1 < iVar2);
    } while (pbVar8 < pbVar7);
  }
  else {
    this._M_current = pbVar4 + -1;
  }
  std::__cxx11::string::operator=(begin,(string *)this._M_current);
  std::__cxx11::string::operator=((string *)this._M_current,(string *)&local_50);
  uVar3 = extraout_RDX;
  if (local_50 != (string *)&local_40) {
    operator_delete(local_50,local_40 + 1);
    uVar3 = extraout_RDX_00;
  }
  pVar9._9_7_ = (undefined7)((ulong)uVar3 >> 8);
  pVar9.second = end <= pbVar4;
  pVar9.first._M_current = this._M_current;
  return pVar9;
}

Assistant:

std::pair<Iter, bool> partition_right(Iter begin, Iter end, Compare comp) {

  using T = typename std::iterator_traits<Iter>::value_type;

  // Move pivot into local for speed.
  T pivot(std::move(*begin));

  Iter first = begin;
  Iter last = end;

  // Find the first element greater than or equal than the pivot
  // (the median of 3 guarantees/ this exists).
  while (comp(*++first, pivot));

  // Find the first element strictly smaller than the pivot.
  // We have to guard this search if there was no element before *first.
  if (first - 1 == begin) while (first < last && !comp(*--last, pivot));
  else while (!comp(*--last, pivot));

  // If the first pair of elements that should be swapped to partition
  // are the same element, the passed in sequence already was correctly
  // partitioned.
  bool already_partitioned = first >= last;

  // Keep swapping pairs of elements that are on the wrong side of the pivot.
  // Previously swapped pairs guard the searches,
  // which is why the first iteration is special-cased above.
  while (first < last) {
    std::iter_swap(first, last);
    while (comp(*++first, pivot));
    while (!comp(*--last, pivot));
  }

  // Put the pivot in the right place.
  Iter pivot_pos = first - 1;
  *begin = std::move(*pivot_pos);
  *pivot_pos = std::move(pivot);

  return std::make_pair(pivot_pos, already_partitioned);
}